

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# treemodel.cpp
# Opt level: O0

CBString * __thiscall
TreeModel::data(CBString *__return_storage_ptr__,TreeModel *this,UModelIndex *index,int role)

{
  bool bVar1;
  int column;
  TreeItem *this_00;
  TreeItem *item;
  int role_local;
  UModelIndex *index_local;
  TreeModel *this_local;
  
  bVar1 = UModelIndex::isValid(index);
  if (bVar1) {
    if ((role == 0) || (role == 0x100)) {
      this_00 = (TreeItem *)UModelIndex::internalPointer(index);
      if (role == 0) {
        column = UModelIndex::column(index);
        TreeItem::data(__return_storage_ptr__,this_00,column);
      }
      else {
        TreeItem::info(__return_storage_ptr__,this_00);
      }
    }
    else {
      Bstrlib::CBString::CBString(__return_storage_ptr__);
    }
  }
  else {
    Bstrlib::CBString::CBString(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

UString TreeModel::data(const UModelIndex &index, int role) const
{
    if (!index.isValid())
        return UString();
    
    if (role != 0 && role != 0x0100)
        return UString();
    
    TreeItem *item = static_cast<TreeItem*>(index.internalPointer());
    
    if (role == 0)
        return item->data(index.column());
    else
        return item->info();
}